

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

SP __thiscall pbrt::remeshVertices(pbrt *this,SP *in)

{
  element_type *peVar1;
  pointer pvVar2;
  long lVar3;
  pointer pvVar4;
  float fVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t i;
  ulong uVar9;
  pointer pvVar10;
  long lVar11;
  mapped_type mVar12;
  SP SVar13;
  key_type local_90;
  vector<int,_std::allocator<int>_> indexRemap;
  map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
  vertexID;
  
  std::make_shared<pbrt::QuadMesh,std::shared_ptr<pbrt::Material>&>
            ((shared_ptr<pbrt::Material> *)this);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
               *)(*(long *)this + 0x30),
              &(((in->super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               super_Shape).textures._M_t);
  peVar1 = (in->super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::vector<int,_std::allocator<int>_>::vector
            (&indexRemap,
             ((long)(peVar1->vertex).
                    super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->vertex).
                   super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl
                   .super__Vector_impl_data._M_start) / 0xc,(allocator_type *)&vertexID);
  vertexID._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vertexID._M_t._M_impl.super__Rb_tree_header._M_header;
  vertexID._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vertexID._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vertexID._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar11 = 0;
  uVar9 = 0;
  vertexID._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vertexID._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    peVar1 = (in->super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pvVar2 = (peVar1->vertex).
             super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(peVar1->vertex).
                       super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0xc) <= uVar9)
    break;
    local_90.p.z = *(float *)((long)&pvVar2->z + lVar11);
    local_90.p._0_8_ = *(undefined8 *)((long)&pvVar2->x + lVar11);
    pvVar2 = (peVar1->normal).
             super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar2 == (peVar1->normal).
                  super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      local_90.n.x = 0.0;
      local_90.n.y = 0.0;
      local_90.n.z = 0.0;
    }
    else {
      local_90.n._0_8_ = *(undefined8 *)((long)&pvVar2->x + lVar11);
      local_90.n.z = *(float *)((long)&pvVar2->z + lVar11);
    }
    iVar6 = std::
            _Rb_tree<pbrt::FatVertex,_std::pair<const_pbrt::FatVertex,_int>,_std::_Select1st<std::pair<const_pbrt::FatVertex,_int>_>,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
            ::find(&vertexID._M_t,&local_90);
    if ((_Rb_tree_header *)iVar6._M_node == &vertexID._M_t._M_impl.super__Rb_tree_header) {
      lVar3 = *(long *)this;
      mVar12 = (mapped_type)((*(long *)(lVar3 + 0x78) - *(long *)(lVar3 + 0x70)) / 0xc);
      std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::push_back
                ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)(lVar3 + 0x70),
                 (value_type *)
                 ((long)&((((in->super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->vertex).
                          super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                          _M_impl.super__Vector_impl_data._M_start)->x + lVar11));
      peVar1 = (in->super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pvVar2 = (peVar1->normal).
               super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pvVar2 != (peVar1->normal).
                    super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::push_back
                  ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                   (*(long *)this + 0x88),(value_type *)((long)&pvVar2->x + lVar11));
      }
      pmVar7 = std::
               map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
               ::operator[]((map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
                             *)&vertexID._M_t,&local_90);
      *pmVar7 = mVar12;
    }
    else {
      mVar12 = *(mapped_type *)&iVar6._M_node[1]._M_right;
    }
    indexRemap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar9] = mVar12;
    uVar9 = uVar9 + 1;
    lVar11 = lVar11 + 0xc;
  }
  pvVar4 = (peVar1->index).super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar10 = (peVar1->index).
                 super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
                 super__Vector_impl_data._M_start; pvVar10 != pvVar4; pvVar10 = pvVar10 + 1) {
    fVar5 = -NAN;
    local_90.p.x = fVar5;
    if (-1 < (long)pvVar10->x) {
      local_90.p.x = (float)indexRemap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[pvVar10->x];
    }
    local_90.p.y = fVar5;
    if (-1 < pvVar10->y) {
      local_90.p.y = (float)indexRemap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(uint)pvVar10->y];
    }
    local_90.p.z = fVar5;
    if (-1 < pvVar10->z) {
      local_90.p.z = (float)indexRemap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(uint)pvVar10->z];
    }
    if (-1 < pvVar10->w) {
      fVar5 = (float)indexRemap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(uint)pvVar10->w];
    }
    local_90.n.x = fVar5;
    std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::
    emplace_back<pbrt::math::vec4i>
              ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)
               (*(long *)this + 0xa0),(vec4i *)&local_90);
  }
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "#pbrt:semantic: done remapping quad mesh. #verts: ");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  poVar8 = std::operator<<(poVar8," -> ");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::
  _Rb_tree<pbrt::FatVertex,_std::pair<const_pbrt::FatVertex,_int>,_std::_Select1st<std::pair<const_pbrt::FatVertex,_int>_>,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
  ::~_Rb_tree(&vertexID._M_t);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indexRemap.super__Vector_base<int,_std::allocator<int>_>);
  SVar13.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar13.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SP)SVar13.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QuadMesh::SP remeshVertices(QuadMesh::SP in)
  {
    QuadMesh::SP out = std::make_shared<QuadMesh>(in->material);
    out->textures = in->textures;

    std::vector<int> indexRemap(in->vertex.size());
    std::map<FatVertex,int> vertexID;
    for (size_t i=0;i<in->vertex.size();i++) {
      FatVertex oldVertex;
      oldVertex.p = in->vertex[i];
      oldVertex.n = in->normal.empty()?vec3f(0.f):in->normal[i];

      auto it = vertexID.find(oldVertex);
      if (it == vertexID.end()) {
        int newID = (int)out->vertex.size();
        out->vertex.push_back(in->vertex[i]);
        if (!in->normal.empty())
          out->normal.push_back(in->normal[i]);
        // if (!in->texcoord.empty())
        //   out->texcoord.push_back(in->texcoord[i]);
        vertexID[oldVertex] = newID;
        indexRemap[i] = newID;
      } else {
        indexRemap[i] = it->second;
      }
    }
    for (auto idx : in->index) 
      out->index.push_back(vec4i(idx.x < 0 ? -1 : indexRemap[idx.x],
                                 idx.y < 0 ? -1 : indexRemap[idx.y],
                                 idx.z < 0 ? -1 : indexRemap[idx.z],
                                 idx.w < 0 ? -1 : indexRemap[idx.w]));
    std::cout << "#pbrt:semantic: done remapping quad mesh. #verts: " << in->vertex.size() << " -> " << out->vertex.size() << std::endl;
    return out;
  }